

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O3

void __thiscall chipemu::implementation::nmos::nmos(nmos *this,void **vtt,chip_description *desc)

{
  pointer *pptVar1;
  pointer *ppptVar2;
  transdef *ptVar3;
  ushort *puVar4;
  ushort uVar5;
  ushort uVar6;
  void *pvVar7;
  bool *pbVar8;
  iterator __position;
  iterator iVar9;
  pointer ptVar10;
  pointer pptVar11;
  pointer puVar12;
  pointer puVar13;
  uint16_t uVar14;
  nmos *pnVar15;
  undefined8 uVar16;
  pointer pcVar17;
  chip_description *pcVar18;
  pointer __result;
  pointer pcVar19;
  logic_error *this_00;
  out_of_range *this_01;
  _Tp_alloc_type *__alloc;
  pointer pcVar20;
  transdef *ptVar21;
  ulong uVar22;
  _Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  *p_Var23;
  pointer pcVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  uint16_t *puVar28;
  long lVar29;
  ulong uVar30;
  ushort uVar31;
  ushort uVar32;
  _Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  *this_02;
  ulong uVar33;
  pointer pcVar34;
  undefined1 auVar35 [32];
  vector<unsigned_short,_std::allocator<unsigned_short>_> nodes;
  vector<unsigned_short,_std::allocator<unsigned_short>_> node_offsets;
  unsigned_short local_102;
  nmos *local_100;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_f8;
  undefined1 local_d8 [16];
  pointer local_c8;
  pointer local_b8;
  pointer local_b0;
  pointer local_a8;
  chip_description *local_a0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_98;
  pair<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_78;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_48;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_40;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_38;
  
  pvVar7 = *vtt;
  *(void **)this = pvVar7;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar7 + -0x48)) = vtt[1];
  local_38 = &this->changed_queue;
  local_48 = &this->current_group;
  local_40 = &this->change_order;
  auVar35 = ZEXT1632(ZEXT816(0) << 0x40);
  this->changed_feeding = (iterator)auVar35._0_8_;
  this->current_group = (vector<unsigned_short,_std::allocator<unsigned_short>_>)auVar35._8_24_;
  this->changed_queue = (vector<unsigned_short,_std::allocator<unsigned_short>_>)auVar35._0_24_;
  this->changed_eating = (iterator)auVar35._24_8_;
  (this->group_tail)._M_current = (unsigned_short *)0x0;
  auVar35 = ZEXT1632(ZEXT816(0) << 0x40);
  this->nodes = (vector<unsigned_short,_std::allocator<unsigned_short>_>)auVar35._0_24_;
  (this->node_offsets).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar35._24_8_;
  *(undefined1 (*) [32])
   &(this->node_offsets).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
    .super__Vector_impl_data._M_finish = auVar35;
  (this->change_order).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar14 = desc->node_ground;
  this->power = desc->node_power;
  this->ground = uVar14;
  local_c8 = (pointer)0x0;
  local_d8 = ZEXT416(0) << 0x40;
  __result = (pointer)operator_new(0x38);
  __result->is_pullup = false;
  auVar35 = ZEXT1632(ZEXT816(0) << 0x40);
  __result->gates =
       (vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
        )auVar35._0_24_;
  (__result->sibling_connectors).
  super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar35._24_8_;
  *(undefined1 (*) [32])
   &(__result->gates).
    super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar35;
  pcVar20 = __result + 1;
  local_d8._8_8_ = pcVar20;
  local_d8._0_8_ = __result;
  pcVar24 = pcVar20;
  local_100 = this;
  local_c8 = pcVar20;
  local_a0 = desc;
  if (desc->node_count != 0) {
    uVar33 = 0;
    do {
      pbVar8 = local_a0->pullups;
      if (pcVar24 == pcVar20) {
        pcVar34 = (pointer)((long)pcVar24 - (long)__result);
        if (pcVar34 == (pointer)0x7ffffffffffffff8) {
          local_d8._8_8_ = pcVar24;
          local_d8._0_8_ = __result;
          local_c8 = pcVar20;
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar30 = ((long)pcVar34 >> 3) * 0x6db6db6db6db6db7;
        uVar22 = uVar30;
        if (pcVar24 == __result) {
          uVar22 = 1;
        }
        p_Var23 = (_Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                   *)(uVar22 + uVar30);
        if ((_Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
             *)0x249249249249248 < p_Var23) {
          p_Var23 = (_Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                     *)0x249249249249249;
        }
        __alloc = (_Tp_alloc_type *)(uVar22 + uVar30);
        this_02 = (_Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                   *)0x249249249249249;
        if (!CARRY8(uVar22,uVar30)) {
          this_02 = p_Var23;
        }
        local_b0 = __result;
        local_a8 = pcVar20;
        __result = std::
                   _Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                   ::_M_allocate(this_02,(size_t)vtt);
        pcVar17 = local_b0;
        *(bool *)((long)__result + (long)pcVar34) = pbVar8[uVar33];
        *(undefined1 (*) [32])((long)&__result->gates + (long)pcVar34) =
             ZEXT1632(ZEXT816(0) << 0x40);
        *(undefined1 (*) [32])
         ((long)&(__result->gates).
                 super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + (long)pcVar34) =
             ZEXT1632(ZEXT816(0) << 0x40);
        pcVar19 = std::
                  vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                  ::_S_relocate(local_b0,pcVar24,__result,__alloc);
        vtt = (void **)pcVar24;
        if (pcVar17 != (pointer)0x0) {
          operator_delete(pcVar17,(ulong)pcVar34);
          vtt = (void **)pcVar34;
        }
        pcVar20 = __result + (long)this_02;
      }
      else {
        pcVar24->is_pullup = pbVar8[uVar33];
        auVar35 = ZEXT1632(ZEXT816(0) << 0x40);
        pcVar24->gates =
             (vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
              )auVar35._0_24_;
        (pcVar24->sibling_connectors).
        super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar35._24_8_;
        *(undefined1 (*) [32])
         &(pcVar24->gates).
          super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar35;
        pcVar19 = pcVar24;
      }
      pcVar24 = pcVar19 + 1;
      uVar33 = uVar33 + 1;
    } while (uVar33 < local_a0->node_count);
    local_d8._8_8_ = pcVar24;
    local_d8._0_8_ = __result;
    local_c8 = pcVar20;
  }
  pcVar18 = local_a0;
  local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = &local_a0->transistors->gate;
  if (local_a0->transistor_count != 0) {
    uVar33 = ((long)pcVar24 - (long)__result >> 3) * 0x6db6db6db6db6db7;
    ptVar21 = (transdef *)
              local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      uVar32 = ((transdef *)
               local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start)->gate;
      uVar22 = (ulong)uVar32;
      if (((uVar33 < uVar22 || uVar33 - uVar22 == 0) ||
          (uVar5 = ((transdef *)
                   local_78.first.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start)->c1, uVar33 < uVar5 || uVar33 - uVar5 == 0)) ||
         (uVar6 = ((transdef *)
                  local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                  ._M_impl.super__Vector_impl_data._M_start)->c2,
         uVar33 < uVar6 || uVar33 - uVar6 == 0)) {
        this_01 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this_01,"node id");
        __cxa_throw(this_01,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      lVar29 = (long)local_78.first.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start - (long)ptVar21;
      lVar27 = (lVar29 >> 1) * -0x5555555555555555 >> 2;
      if (0 < lVar27) {
        ptVar3 = ptVar21 + lVar27 * 4;
        lVar27 = lVar27 + 1;
        ptVar21 = ptVar21 + 2;
        do {
          if ((ptVar21[-2].gate == uVar32) &&
             (((ptVar21[-2].c1 == uVar5 && (ptVar21[-2].c2 == uVar6)) ||
              ((ptVar21[-2].c1 == uVar6 && (ptVar21[-2].c2 == uVar5)))))) {
            ptVar21 = ptVar21 + -2;
            goto LAB_00111a80;
          }
          if ((ptVar21[-1].gate == uVar32) &&
             (((ptVar21[-1].c1 == uVar5 && (ptVar21[-1].c2 == uVar6)) ||
              ((ptVar21[-1].c1 == uVar6 && (ptVar21[-1].c2 == uVar5)))))) {
            ptVar21 = ptVar21 + -1;
            goto LAB_00111a80;
          }
          if ((ptVar21->gate == uVar32) &&
             (((ptVar21->c1 == uVar5 && (ptVar21->c2 == uVar6)) ||
              ((ptVar21->c1 == uVar6 && (ptVar21->c2 == uVar5)))))) goto LAB_00111a80;
          if ((ptVar21[1].gate == uVar32) &&
             (((ptVar21[1].c1 == uVar5 && (ptVar21[1].c2 == uVar6)) ||
              ((ptVar21[1].c1 == uVar6 && (ptVar21[1].c2 == uVar5)))))) {
            ptVar21 = ptVar21 + 1;
            goto LAB_00111a80;
          }
          lVar27 = lVar27 + -1;
          ptVar21 = ptVar21 + 4;
        } while (1 < lVar27);
        lVar29 = (long)local_78.first.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start - (long)ptVar3;
        ptVar21 = ptVar3;
      }
      lVar27 = (lVar29 >> 1) * -0x5555555555555555;
      if (lVar27 == 1) {
LAB_00111a49:
        if ((ptVar21->gate == uVar32) &&
           (((ptVar21->c1 == uVar5 && (ptVar21->c2 == uVar6)) ||
            ((ptVar21->c1 == uVar6 && (ptVar21->c2 == uVar5)))))) goto LAB_00111a80;
LAB_00111a89:
        __position._M_current =
             __result[uVar22].gates.
             super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            __result[uVar22].gates.
            super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<chipemu::implementation::transdef,std::allocator<chipemu::implementation::transdef>>
          ::_M_realloc_insert<chipemu::implementation::transdef_const&>
                    ((vector<chipemu::implementation::transdef,std::allocator<chipemu::implementation::transdef>>
                      *)&__result[uVar22].gates,__position,
                     (transdef *)
                     local_78.first.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start);
        }
        else {
          (__position._M_current)->c2 =
               ((transdef *)
               local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start)->c2;
          uVar14 = ((transdef *)
                   local_78.first.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start)->c1;
          (__position._M_current)->gate =
               ((transdef *)
               local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start)->gate;
          (__position._M_current)->c1 = uVar14;
          pptVar1 = &__result[uVar22].gates.
                     super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
        uVar32 = *(uint16_t *)
                  ((long)local_78.first.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start + 2);
        iVar9._M_current =
             __result[uVar32].sibling_connectors.
             super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            __result[uVar32].sibling_connectors.
            super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<chipemu::implementation::transdef_const*,std::allocator<chipemu::implementation::transdef_const*>>
          ::_M_realloc_insert<chipemu::implementation::transdef_const*const&>
                    ((vector<chipemu::implementation::transdef_const*,std::allocator<chipemu::implementation::transdef_const*>>
                      *)&__result[uVar32].sibling_connectors,iVar9,(transdef **)&local_78);
        }
        else {
          *iVar9._M_current =
               (transdef *)
               local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
          ppptVar2 = &__result[uVar32].sibling_connectors.
                      super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *ppptVar2 = *ppptVar2 + 1;
        }
        uVar32 = *(uint16_t *)
                  ((long)local_78.first.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start + 4);
        iVar9._M_current =
             __result[uVar32].sibling_connectors.
             super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            __result[uVar32].sibling_connectors.
            super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<chipemu::implementation::transdef_const*,std::allocator<chipemu::implementation::transdef_const*>>
          ::_M_realloc_insert<chipemu::implementation::transdef_const*const&>
                    ((vector<chipemu::implementation::transdef_const*,std::allocator<chipemu::implementation::transdef_const*>>
                      *)&__result[uVar32].sibling_connectors,iVar9,(transdef **)&local_78);
        }
        else {
          *iVar9._M_current =
               (transdef *)
               local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
          ppptVar2 = &__result[uVar32].sibling_connectors.
                      super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *ppptVar2 = *ppptVar2 + 1;
        }
      }
      else {
        if (lVar27 == 2) {
LAB_00111a23:
          if ((ptVar21->gate != uVar32) ||
             (((ptVar21->c1 != uVar5 || (ptVar21->c2 != uVar6)) &&
              ((ptVar21->c1 != uVar6 || (ptVar21->c2 != uVar5)))))) {
            ptVar21 = ptVar21 + 1;
            goto LAB_00111a49;
          }
        }
        else {
          if (lVar27 != 3) goto LAB_00111a89;
          if ((ptVar21->gate != uVar32) ||
             (((ptVar21->c1 != uVar5 || (ptVar21->c2 != uVar6)) &&
              ((ptVar21->c1 != uVar6 || (ptVar21->c2 != uVar5)))))) {
            ptVar21 = ptVar21 + 1;
            goto LAB_00111a23;
          }
        }
LAB_00111a80:
        if (ptVar21 ==
            (transdef *)
            local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_start) goto LAB_00111a89;
      }
      local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)local_78.first.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start + 6);
      ptVar21 = pcVar18->transistors;
    } while ((transdef *)
             local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start != ptVar21 + pcVar18->transistor_count);
  }
  local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_short *)0x0;
  local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
  local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_short *)0x0;
  local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
  local_102 = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_realloc_insert<unsigned_short>
            (&local_98,(iterator)0x0,&local_102);
  if (1 < (ulong)(((long)(local_d8._8_8_ - local_d8._0_8_) >> 3) * 0x6db6db6db6db6db7)) {
    local_b8 = (pointer)local_d8._0_8_;
    uVar33 = 1;
    uVar32 = 2;
    do {
      uVar22 = (long)local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 1;
      if (0xfffe < uVar22) {
        __assert_fail("std::numeric_limits<uint16_t>::max() > nodes.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/GBuella[P]chipemu/src/nmos.cc"
                      ,0x144,
                      "pair<vector<uint16_t>, vector<uint16_t>> chipemu::implementation::create_nodes(const vector<construct_node> &)"
                     );
      }
      local_102 = (unsigned_short)uVar22;
      if (local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  (&local_98,
                   (iterator)
                   local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_102);
      }
      else {
        *local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish = local_102;
        local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_102 = (unsigned_short)local_b8[uVar33].is_pullup;
      if (local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  (&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_102);
      }
      else {
        *local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish = local_102;
        local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_102 = (short)((uint)(*(int *)&local_b8[uVar33].gates.
                                          super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                *(int *)&local_b8[uVar33].gates.
                                         super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 1) * -0x5555;
      if (local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  (&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_102);
        pcVar24 = (pointer)local_d8._0_8_;
      }
      else {
        *local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish = local_102;
        local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        pcVar24 = local_b8;
      }
      local_102 = (unsigned_short)
                  ((uint)(*(int *)&pcVar24[uVar33].sibling_connectors.
                                   super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                         *(int *)&pcVar24[uVar33].sibling_connectors.
                                  super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  (&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_102);
        pcVar24 = (pointer)local_d8._0_8_;
      }
      else {
        *local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish = local_102;
        local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                (&local_f8,
                 ((ulong)((long)pcVar24[uVar33].gates.
                                super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)pcVar24[uVar33].gates.
                               super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 1) * 0x5555555555555556
                 + ((long)local_f8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_f8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 1));
      uVar16 = local_d8._0_8_;
      pcVar24 = (pointer)local_d8._0_8_;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                (&local_f8,
                 ((long)(((pointer)(local_d8._0_8_ + uVar33 * 0x38))->sibling_connectors).
                        super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(((pointer)(local_d8._0_8_ + uVar33 * 0x38))->sibling_connectors).
                        super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) +
                 ((long)local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 1));
      uVar33 = (ulong)uVar32;
      local_b8 = (pointer)uVar16;
      uVar22 = ((long)(local_d8._8_8_ - uVar16) >> 3) * 0x6db6db6db6db6db7;
      uVar32 = uVar32 + 1;
    } while (uVar33 <= uVar22 && uVar22 - uVar33 != 0);
    if (1 < uVar22) {
      local_b0 = (pointer)local_98.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start;
      local_a8 = (pointer)local_f8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start;
      uVar26 = 1;
      uVar33 = 1;
      do {
        ptVar10 = (((pointer)(uVar16 + uVar33 * 0x38))->gates).
                  super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar27 = (long)(((pointer)(uVar16 + uVar33 * 0x38))->gates).
                       super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar10;
        if (lVar27 != 0) {
          uVar30 = (lVar27 >> 1) * -0x5555555555555555;
          lVar27 = (ulong)*(ushort *)
                           ((bool *)local_98.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar33 * 2) * 2;
          puVar28 = &ptVar10->c2;
          uVar33 = 0;
          do {
            *(uint16_t *)
             ((undefined1 *)
              ((long)local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start + 6) + uVar33 * 4 + lVar27) =
                 puVar28[-1] * 2;
            *(uint16_t *)
             ((long)&(((vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                        *)((long)local_f8.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 8))->
                     super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar33 * 4 + lVar27) =
                 *puVar28 * 2;
            uVar33 = uVar33 + 1;
            puVar28 = puVar28 + 3;
          } while ((uVar33 & 0xffff) <= uVar30 && uVar30 - (uVar33 & 0xffff) != 0);
        }
        uVar26 = uVar26 + 1;
        uVar33 = (ulong)(uVar26 & 0xffff);
      } while (uVar33 <= uVar22 && uVar22 - uVar33 != 0);
      uVar32 = 1;
      uVar33 = 1;
      do {
        pptVar11 = (((pointer)(uVar16 + uVar33 * 0x38))->sibling_connectors).
                   super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        lVar27 = (long)(((pointer)(uVar16 + uVar33 * 0x38))->sibling_connectors).
                       super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pptVar11;
        if (lVar27 != 0) {
          uVar5 = *(ushort *)
                   ((bool *)local_98.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar33 * 2);
          uVar6 = *(ushort *)
                   ((undefined1 *)
                    ((long)local_f8.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start + 2) + (ulong)uVar5 * 2);
          uVar33 = 0;
          uVar31 = 0;
          do {
            ptVar21 = pptVar11[uVar33];
            if (*(short *)((undefined1 *)
                           ((long)local_f8.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 2) +
                          (ulong)*(ushort *)
                                  ((bool *)local_98.
                                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                  (ulong)ptVar21->gate * 2) * 2) == 0) {
LAB_001120af:
              this_00 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(this_00,"building nodes");
              __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            uVar30 = (ulong)((uint)*(ushort *)
                                    ((bool *)local_98.
                                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                    (ulong)ptVar21->gate * 2) * 2);
            lVar25 = -6 - uVar30;
            lVar29 = 0;
            while ((*(ushort *)
                     ((undefined1 *)
                      ((long)local_f8.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start + 6) + lVar29 * 4 + uVar30) >>
                    1 != ptVar21->c1 ||
                   (*(ushort *)
                     ((long)&(((vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                                *)((long)local_f8.
                                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 8))->
                             super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar29 * 4 + uVar30) >> 1
                    != ptVar21->c2))) {
              lVar25 = lVar25 + -4;
              lVar29 = lVar29 + 1;
              if (*(short *)((undefined1 *)
                             ((long)local_f8.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 2) +
                            (ulong)*(ushort *)
                                    ((bool *)local_98.
                                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                    (ulong)ptVar21->gate * 2) * 2) == (short)lVar29)
              goto LAB_001120af;
            }
            *(short *)((undefined1 *)
                       ((long)local_f8.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start + 6) +
                      uVar33 * 2 + (ulong)uVar6 * 4 + (ulong)uVar5 * 2) =
                 (short)((uint)(ptVar21->c1 == uVar32) * 2 - (int)lVar25 >> 1);
            uVar31 = uVar31 + 1;
            uVar33 = (ulong)uVar31;
          } while (uVar33 < (ulong)(lVar27 >> 3));
        }
        uVar32 = uVar32 + 1;
        uVar33 = (ulong)uVar32;
      } while (uVar33 <= uVar22 && uVar22 - uVar33 != 0);
    }
  }
  std::
  pair<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  ::
  pair<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_&,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_&,_true>
            (&local_78,&local_98,&local_f8);
  pcVar18 = local_a0;
  pnVar15 = local_100;
  if ((pointer)local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  puVar12 = (pnVar15->node_offsets).
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar13 = (pnVar15->node_offsets).
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (pnVar15->node_offsets).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start;
  (pnVar15->node_offsets).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (pnVar15->node_offsets).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar12 != (pointer)0x0) {
    operator_delete(puVar12,(long)puVar13 - (long)puVar12);
  }
  puVar12 = (pnVar15->nodes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar13 = (pnVar15->nodes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pnVar15->nodes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.second.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start;
  (pnVar15->nodes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.second.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (pnVar15->nodes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.second.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_78.second.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.second.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.second.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((puVar12 != (pointer)0x0) &&
     (operator_delete(puVar12,(long)puVar13 - (long)puVar12),
     local_78.second.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_78.second.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.second.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.second.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.first.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.first.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.first.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  uVar26 = pcVar18->node_count;
  pnVar15->desc_nodes_count = (uint16_t)uVar26;
  pnVar15->desc_transistor_count = (uint16_t)pcVar18->transistor_count;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (local_38,(ulong)((uVar26 & 0xffff) << 5));
  puVar12 = (pnVar15->changed_queue).
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start;
  (pnVar15->changed_feeding)._M_current = puVar12;
  (pnVar15->changed_eating)._M_current = puVar12;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (local_40,(ulong)pnVar15->desc_nodes_count);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (local_48,(ulong)pnVar15->desc_nodes_count << 5);
  puVar4 = (pnVar15->nodes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start +
           (pnVar15->node_offsets).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start[pnVar15->power];
  *puVar4 = *puVar4 | 4;
  std::
  vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  ::~vector((vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
             *)local_d8);
  return;
}

Assistant:

nmos::nmos(const chip_description& desc):
    power(desc.node_power),
    ground(desc.node_ground)
{
    auto cnodes = create_construct_nodes(desc);
    setup_transistors(desc, cnodes);
    tie(node_offsets, nodes) = create_nodes(cnodes);
    desc_nodes_count = desc.node_count;
    desc_transistor_count = desc.transistor_count;
    changed_queue_init();
    change_order.resize(node_count());
    group_init();
    node_addr(power)[0] |= node_is_high;
}